

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Sector_SetCeilingPanning
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  int secnum;
  FSectorTagIterator itr;
  double yofs;
  double xofs;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  itr = (FSectorTagIterator)((double)arg3 + (double)arg4 / 100.0);
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)&stack0xffffffffffffffc0,arg0);
  while( true ) {
    iVar1 = FSectorTagIterator::Next((FSectorTagIterator *)&stack0xffffffffffffffc0);
    if (iVar1 < 0) break;
    sector_t::SetXOffset(sectors + iVar1,1,(double)arg1 + (double)arg2 / 100.0);
    sector_t::SetYOffset(sectors + iVar1,1,(double)itr);
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetCeilingPanning)
// Sector_SetCeilingPanning (tag, x-int, x-frac, y-int, y-frac)
{
	double xofs = arg1 + arg2 / 100.;
	double yofs = arg3 + arg4 / 100.;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
	{
		sectors[secnum].SetXOffset(sector_t::ceiling, xofs);
		sectors[secnum].SetYOffset(sector_t::ceiling, yofs);
	}
	return true;
}